

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> m;
  Function *pFVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  raw_ostream *prVar5;
  DGLLVMPointerAnalysis *this;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  _Var6;
  ostream *poVar7;
  undefined4 extraout_var;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  _func_int **pp_Var10;
  Value *val;
  long *plVar11;
  uint i;
  uint uVar13;
  string *Str;
  StringRef SVar14;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  const_iterator __begin5;
  Function *llvmFunc;
  long local_460;
  _func_int **local_458;
  long local_450;
  _func_int **local_448;
  _func_int **local_440;
  const_iterator __end5;
  LLVMContext context;
  TimeMeasure tm;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  LLVMPointerAnalysisOptions local_110;
  LLVMPointerAnalysisOptions local_a0;
  long lVar12;
  
  setupStackTraceOnError(argc,argv);
  iVar4 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  if (verbose_more[0x80] == '\x01') {
    PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
         (_func_int **)CONCAT71(PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis._1_7_,1);
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,false,llvm::cl::parser<bool>> *)verbose,(bool *)&PTA);
  }
  if (callgraph_only[0x80] == '\x01') {
    PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
         (_func_int **)CONCAT71(PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis._1_7_,1);
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,false,llvm::cl::parser<bool>> *)callgraph,(bool *)&PTA);
  }
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-pta-dump",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) goto LAB_0011c443;
  if (display_only_abi_cxx11_._136_8_ != 0) {
    splitList((string *)&PTA,'@');
    for (Str = (string *)PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis;
        Str != (string *)
               PTA.super_LLVMPointerAnalysis.options.super_LLVMAnalysisOptions.entryFunction.
               _M_dataplus._M_p; Str = Str + 1) {
      SVar14.Length = (size_t)(Str->_M_dataplus)._M_p;
      SVar14.Data = (char *)M._M_t.
                            super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                            .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl;
      llvmFunc = (Function *)llvm::Module::getFunction(SVar14);
      if (llvmFunc == (Function *)0x0) {
        prVar5 = (raw_ostream *)llvm::errs();
        prVar5 = llvm::raw_ostream::operator<<(prVar5,"Invalid function to display: ");
        prVar5 = llvm::raw_ostream::operator<<(prVar5,Str);
        llvm::raw_ostream::operator<<(prVar5,". Function not found in the module\n");
        iVar4 = 1;
        goto LAB_0011bec5;
      }
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                (&display_only_func,&llvmFunc);
    }
    iVar4 = 0;
LAB_0011bec5:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&PTA);
    if (Str != (string *)
               PTA.super_LLVMPointerAnalysis.options.super_LLVMAnalysisOptions.entryFunction.
               _M_dataplus._M_p) goto LAB_0011c443;
  }
  tm.s.__d.__r = (duration)0;
  tm.e.__d.__r = (duration)0;
  if (dump_ir[0x80] == '\0') {
    this = (DGLLVMPointerAnalysis *)operator_new(0x90);
    m = M;
    dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
              (&local_a0,(LLVMPointerAnalysisOptions *)&options);
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (this,(Module *)
                    m._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                    _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                    super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_a0);
    dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_a0);
    tm.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    (*(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[3])(this);
    tm.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    std::__cxx11::string::string
              ((string *)&PTA,"INFO: Pointer analysis took",(allocator *)&llvmFunc);
    dg::debug::TimeMeasure::report(&tm,(string *)&PTA,(ostream *)&std::cerr);
    std::__cxx11::string::_M_dispose();
    if (_stats[0x80] == '\x01') {
      if (options.dgOptions.PTAOptions.analysisType == svf) {
        prVar5 = (raw_ostream *)llvm::errs();
        llvm::raw_ostream::operator<<(prVar5,"SVF analysis does not support stats dumping\n");
      }
      else {
        dumpStats(this);
      }
    }
    else if (_quiet[0x80] == '\0') {
      if (dump_c_lines[0x80] == '\x01') {
        allocasToVars((Module *)&PTA);
        std::
        _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::_M_move_assign(&valuesToVars._M_t,&PTA);
        std::
        _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
        ::~_Rb_tree((_Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                     *)&PTA);
        if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          prVar5 = (raw_ostream *)llvm::errs();
          prVar5 = llvm::raw_ostream::operator<<(prVar5,"WARNING: No debugging information found, ")
          ;
          llvm::raw_ostream::operator<<(prVar5,"the C lines output will be corrupted\n");
        }
      }
      local_460 = (long)M._M_t.
                        super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t
                        .super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                        super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x18;
      plVar11 = (long *)((long)M._M_t.
                               super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                               .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x20);
      while (lVar12 = *plVar11, lVar12 != local_460) {
        pp_Var8 = (_func_int **)(lVar12 + -0x38);
        if (lVar12 == 0) {
          pp_Var8 = (_func_int **)0x0;
        }
        if ((display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             display_only_func.
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) ||
           (PTA.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis = pp_Var8,
           _Var6 = std::
                   __find_if<__gnu_cxx::__normal_iterator<llvm::Function_const**,std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<llvm::Function*const>>
                             (display_only_func.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              display_only_func.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&PTA),
           _Var6._M_current !=
           display_only_func.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish)) {
          local_458 = pp_Var8 + 9;
          local_450 = lVar12;
          for (pp_Var8 = pp_Var8 + 10; pp_Var8 = (_func_int **)*pp_Var8, lVar12 = local_450,
              pp_Var8 != local_458; pp_Var8 = pp_Var8 + 1) {
            pp_Var9 = pp_Var8 + -3;
            if (pp_Var8 == (_func_int **)0x0) {
              pp_Var9 = (_func_int **)0x0;
            }
            pp_Var10 = pp_Var9 + 5;
            local_448 = pp_Var10;
            local_440 = pp_Var8;
            for (pp_Var9 = pp_Var9 + 6; pp_Var9 = (_func_int **)*pp_Var9, pp_Var9 != pp_Var10;
                pp_Var9 = pp_Var9 + 1) {
              val = (Value *)(pp_Var9 + -3);
              if (pp_Var9 == (_func_int **)0x0) {
                val = (Value *)0x0;
              }
              if (((*(byte *)(*(long *)val + 8) | 2) == 0xf) &&
                 ((dump_c_lines[0x80] != '\x01' || (val[0x10] != (Value)0x3a)))) {
                (*(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[1])
                          ((LLVMPointsToSet *)&llvmFunc,this,val);
                bVar2 = dg::LLVMPointsToSet::isUnknownSingleton((LLVMPointsToSet *)&llvmFunc);
                if (!bVar2) {
                  valToStr_abi_cxx11_((string *)&PTA,val);
                  poVar7 = std::operator<<((ostream *)&std::cout,(string *)&PTA);
                  std::operator<<(poVar7,"\n");
                  std::__cxx11::string::_M_dispose();
                  pFVar1 = llvmFunc;
                  if (llvmFunc == (Function *)0x0) {
                    __begin5.impl = (LLVMPointsToSetImpl *)(Function *)0x0;
                  }
                  else {
                    cVar3 = (**(code **)(*(long *)llvmFunc + 0x38))(llvmFunc);
                    __begin5.impl = (LLVMPointsToSetImpl *)(Function *)0x0;
                    if (cVar3 == '\0') {
                      __begin5.impl = (LLVMPointsToSetImpl *)pFVar1;
                    }
                  }
                  __end5.impl = (LLVMPointsToSetImpl *)0x0;
                  while (bVar2 = dg::LLVMPointsToSet::const_iterator::operator!=(&__begin5,&__end5),
                        bVar2) {
                    iVar4 = (*(__begin5.impl)->_vptr_LLVMPointsToSetImpl[9])();
                    poVar7 = std::operator<<((ostream *)&std::cout,"  -> ");
                    valToStr_abi_cxx11_((string *)&PTA,(Value *)CONCAT44(extraout_var,iVar4));
                    poVar7 = std::operator<<(poVar7,(string *)&PTA);
                    std::operator<<(poVar7,"\n");
                    std::__cxx11::string::_M_dispose();
                    dg::LLVMPointsToSet::const_iterator::operator++(&__begin5);
                  }
                  cVar3 = (*(code *)**(undefined8 **)llvmFunc)();
                  if (cVar3 != '\0') {
                    std::operator<<((ostream *)&std::cout,"  -> unknown\n");
                  }
                  cVar3 = (**(code **)(*(long *)llvmFunc + 8))();
                  if (cVar3 != '\0') {
                    std::operator<<((ostream *)&std::cout,"  -> null\n");
                  }
                  cVar3 = (**(code **)(*(long *)llvmFunc + 0x10))();
                  if (cVar3 != '\0') {
                    std::operator<<((ostream *)&std::cout,"  -> null + ?\n");
                  }
                  cVar3 = (**(code **)(*(long *)llvmFunc + 0x18))();
                  if (cVar3 != '\0') {
                    std::operator<<((ostream *)&std::cout,"  -> invalidated\n");
                  }
                }
                pp_Var8 = local_440;
                pp_Var10 = local_448;
                if (llvmFunc != (Function *)0x0) {
                  (**(code **)(*(long *)llvmFunc + 0x58))();
                  pp_Var8 = local_440;
                  pp_Var10 = local_448;
                }
              }
            }
          }
        }
        plVar11 = (long *)(lVar12 + 8);
      }
    }
    (*(this->super_LLVMPointerAnalysis)._vptr_LLVMPointerAnalysis[5])();
  }
  else {
    dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
              (&local_110,(LLVMPointerAnalysisOptions *)&options);
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              (&PTA,(Module *)
                    M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                    _M_t.super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                    super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,&local_110);
    dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions(&local_110);
    tm.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dg::DGLLVMPointerAnalysis::initialize(&PTA);
    if (dump_graph_only[0x80] == '\x01') {
      tm.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      std::__cxx11::string::string
                ((string *)&llvmFunc,"INFO: Pointer analysis (building graph) took",
                 (allocator *)&__begin5);
      dg::debug::TimeMeasure::report(&tm,(string *)&llvmFunc,(ostream *)&std::cerr);
      std::__cxx11::string::_M_dispose();
LAB_0011c420:
      dumpPointerGraph(&PTA,options.dgOptions.PTAOptions.analysisType);
    }
    else {
      if (dump_iteration.super_opt_storage<unsigned_long,_false,_false>.Value == 0) {
        dg::pta::PointerAnalysis::run();
      }
      else {
        (**(code **)(*(long *)PTA.PTA._M_t.
                              super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                              .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl
                    + 0x30))
                  (PTA.PTA._M_t.
                   super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                   .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
        dg::pta::PointerAnalysis::initialize_queue
                  ((PointerAnalysis *)
                   PTA.PTA._M_t.
                   super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                   .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
        uVar13 = 0;
        while ((uVar13 < dump_iteration.super_opt_storage<unsigned_long,_false,_false>.Value &&
               (bVar2 = dg::pta::PointerAnalysis::iteration
                                  ((PointerAnalysis *)
                                   PTA.PTA._M_t.
                                   super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                                   .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>.
                                   _M_head_impl), bVar2))) {
          dg::pta::PointerAnalysis::queue_changed
                    ((PointerAnalysis *)
                     PTA.PTA._M_t.
                     super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
                     .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl);
          uVar13 = uVar13 + 1;
        }
      }
      tm.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      std::__cxx11::string::string
                ((string *)&llvmFunc,"INFO: Pointer analysis took",(allocator *)&__begin5);
      dg::debug::TimeMeasure::report(&tm,(string *)&llvmFunc,(ostream *)&std::cerr);
      std::__cxx11::string::_M_dispose();
      if (_stats[0x80] == '\x01') {
        dumpStats(&PTA);
      }
      if (_quiet[0x80] == '\0') goto LAB_0011c420;
    }
    dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis(&PTA);
  }
  iVar4 = 0;
LAB_0011c443:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (verbose_more) {
        verbose = true;
    }
    if (callgraph_only) {
        callgraph = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-dump", context, options);
    if (!M)
        return 1;

    if (!display_only.empty()) {
        for (const auto &func : splitList(display_only)) {
            auto *llvmFunc = M->getFunction(func);
            if (!llvmFunc) {
                llvm::errs() << "Invalid function to display: " << func
                             << ". Function not found in the module\n";
                return 1;
            }
            display_only_func.push_back(llvmFunc);
        }
    }

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

#ifdef HAVE_SVF
    if (opts.isSVF()) {
        assert(dump_iteration == 0 && "SVF does not support -iteration");
        assert(!dump_graph_only && "SVF does not support -dump_graph_only");
        assert(!dump_graph_only && "SVF does not support -statistics yet");
    }
#endif

    if (!dump_ir) {
        std::unique_ptr<LLVMPointerAnalysis> llvmpta;

#ifdef HAVE_SVF
        if (opts.isSVF())
            llvmpta.reset(new SVFPointerAnalysis(M.get(), opts));
        else
#endif
            llvmpta.reset(new DGLLVMPointerAnalysis(M.get(), opts));

        tm.start();
        llvmpta->run();
        tm.stop();
        tm.report("INFO: Pointer analysis took");

        if (_stats) {
            if (opts.isSVF()) {
                llvm::errs() << "SVF analysis does not support stats dumping\n";
            } else {
                dumpStats(static_cast<DGLLVMPointerAnalysis *>(llvmpta.get()));
            }
            return 0;
        }

        if (_quiet) {
            return 0;
        }

        if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
            llvm::errs() << "WARNING: Variables names matching is not "
                            "supported for LLVM older than 3.7\n";
#else
            valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
            if (valuesToVars.empty()) {
                llvm::errs() << "WARNING: No debugging information found, "
                             << "the C lines output will be corrupted\n";
            }
        }

        for (auto &F : *M) {
            if (!display_only_func.empty() &&
                std::find(display_only_func.begin(), display_only_func.end(),
                          &F) == display_only_func.end()) {
                continue;
            }
            for (auto &B : F) {
                for (auto &I : B) {
                    if (!I.getType()->isPointerTy() &&
                        !I.getType()->isIntegerTy()) {
                        continue;
                    }

                    if (dump_c_lines && llvm::isa<llvm::AllocaInst>(&I)) {
                        // do not dump I->I for alloca, it makes no sense for C
                        continue;
                    }

                    auto pts = llvmpta->getLLVMPointsTo(&I);
                    if (pts.isUnknownSingleton()) {
                        // do not dump the "no-information"
                        continue;
                    }

                    std::cout << valToStr(&I) << "\n";
                    for (const auto &ptr : pts) {
                        std::cout << "  -> " << valToStr(ptr.value) << "\n";
                    }
                    if (pts.hasUnknown()) {
                        std::cout << "  -> unknown\n";
                    }
                    if (pts.hasNull()) {
                        std::cout << "  -> null\n";
                    }
                    if (pts.hasNullWithOffset()) {
                        std::cout << "  -> null + ?\n";
                    }
                    if (pts.hasInvalidated()) {
                        std::cout << "  -> invalidated\n";
                    }
                }
            }
        }
        return 0;
    }

    ///
    // Dumping the IR of pointer analysis
    //
    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.initialize();

    if (dump_graph_only) {
        tm.stop();
        tm.report("INFO: Pointer analysis (building graph) took");
        dumpPointerGraph(&PTA, opts.analysisType);
        return 0;
    }

    auto *PA = PTA.getPTA();
    assert(PA && "Did not initialize the analysis");

    // run the analysis
    if (dump_iteration > 0) {
        // do preprocessing and queue the nodes
        PA->preprocess();
        PA->initialize_queue();

        // do fixpoint
        for (unsigned i = 0; i < dump_iteration; ++i) {
            if (!PA->iteration())
                break;
            PA->queue_changed();
        }
    } else {
        PA->run();
    }

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    if (_stats) {
        dumpStats(&PTA);
    }

    if (_quiet)
        return 0;

    dumpPointerGraph(&PTA, opts.analysisType);

    return 0;
}